

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_75d24::CpuAbsoluteIndexedTest::run_read_instruction_with_pagecrossing
          (CpuAbsoluteIndexedTest *this,uint8_t instruction,IndexReg index_reg)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uint16_t uVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  char *message;
  ReturnAction<int> RStack_88;
  MatcherBase<unsigned_short> local_78;
  _Any_data local_60 [2];
  AssertionResult gtest_ar;
  
  uVar2 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar2;
  (this->super_CpuTest).registers.pc = uVar2;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 2;
  if (index_reg == X) {
    (this->super_CpuTest).registers.x = 0xab;
    (this->super_CpuTest).expected.x = 0xab;
  }
  else {
    (this->super_CpuTest).registers.y = 0xab;
    (this->super_CpuTest).expected.y = 0xab;
  }
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x2e,"mmu","read_byte(start_pc + 1u)");
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_88,0x78);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_78,*(short *)&(this->super_CpuTest).field_0x112 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x2f,"mmu","read_byte(start_pc + 2u)");
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_88,0x56);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x5623);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x30,"mmu","read_byte(effective_address - 0x0100)");
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_88,0xcd);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_78,0x5723);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_78);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
                      ,0x32,"mmu","read_byte(effective_address)");
  testing::internal::ReturnAction<unsigned_char>::ReturnAction
            ((ReturnAction<unsigned_char> *)&RStack_88,(this->super_CpuTest).field_0x114);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_60,(ReturnAction *)&RStack_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_88.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_78);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x05');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)&gtest_ar,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_indexed_instructions.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_60[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_60[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void run_read_instruction_with_pagecrossing(uint8_t instruction,
            IndexReg index_reg) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const uint8_t index_reg_value{0xAB};
        set_index_reg(index_reg, index_reg_value);

        const uint16_t effective_address = 0x5678 + index_reg_value;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x78));
        EXPECT_CALL(mmu, read_byte(start_pc + 2u)).WillOnce(Return(0x56));
        EXPECT_CALL(mmu, read_byte(effective_address - 0x0100))
                .WillOnce(Return(0xCD)); // Extra read
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));

        step_execution(5);
        EXPECT_EQ(expected, registers);
    }